

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  size_t __size;
  double *__ptr;
  double *__ptr_00;
  double *__ptr_01;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *__format;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *local_60;
  
  dVar4 = pow(eps,0.3333333333333333);
  __size = (long)N * 8;
  __ptr = (double *)malloc(__size);
  __ptr_00 = (double *)malloc(__size);
  __ptr_01 = (double *)malloc(__size);
  uVar2 = 0;
  uVar3 = 0;
  local_60 = f;
  if (0 < N) {
    uVar3 = (ulong)(uint)N;
  }
  do {
    if (uVar2 == uVar3) {
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      return 0;
    }
    dVar5 = x[uVar2];
    if (ABS(dVar5) < 1.0 / ABS(dx[uVar2])) {
      dVar5 = signx(dVar5);
      dVar5 = dVar5 / ABS(dx[uVar2]);
    }
    for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      dVar6 = x[uVar1];
      __ptr[uVar1] = dVar6;
      __ptr_00[uVar1] = dVar6;
      __ptr_01[uVar1] = dVar6;
    }
    dVar5 = dVar5 * dVar4;
    __ptr[uVar2] = __ptr[uVar2] + dVar5;
    __ptr_01[uVar2] = __ptr_01[uVar2] + dVar5;
    for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      dVar6 = x[uVar1];
      if (ABS(dVar6) < 1.0 / ABS(dx[uVar1])) {
        dVar6 = signx(dVar6);
        dVar6 = dVar6 / ABS(dx[uVar1]);
      }
      dVar6 = dVar6 * dVar4;
      __ptr_00[uVar1] = __ptr_00[uVar1] + dVar6;
      __ptr_01[uVar1] = __ptr_01[uVar1] + dVar6;
      dVar7 = (*funcpt->funcpt)(__ptr_01,N,funcpt->params);
      dVar8 = (*funcpt->funcpt)(__ptr,N,funcpt->params);
      dVar9 = (*funcpt->funcpt)(__ptr_00,N,funcpt->params);
      dVar10 = (*funcpt->funcpt)(x,N,funcpt->params);
      dVar7 = ((dVar7 - dVar8) - (dVar9 - dVar10)) / (dVar5 * dVar6);
      local_60[uVar1] = dVar7;
      if (1.79769313486232e+308 <= ABS(dVar7)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_001214cb:
        printf(__format);
        free(__ptr);
        free(__ptr_00);
        free(__ptr_01);
        return 0xf;
      }
      if (NAN(dVar7)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_001214cb;
      }
      __ptr_00[uVar1] = __ptr_00[uVar1] - dVar6;
      __ptr_01[uVar1] = __ptr_01[uVar1] - dVar6;
    }
    uVar2 = uVar2 + 1;
    local_60 = local_60 + N;
  } while( true );
}

Assistant:

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,retval;
	double stepi,stepj,fd,stepmax;
	double *xi,*xj,*xij;
	
	retval = 0;

	fd = pow((double) eps,1.0/3.0);
	xi = (double*) malloc(sizeof(double) *N);
	xj = (double*) malloc(sizeof(double) *N);
	xij = (double*) malloc(sizeof(double) *N);
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepi = fd * stepmax;
		for(j = 0; j < N;++j) {
			xi[j] = x[j];
			xj[j]= x[j];
			xij[j] = x[j];
		}
		xi[i] += stepi;
		xij[i] += stepi;
		for(j = 0; j < N;++j) {
			if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
				stepmax = x[j];
			} else {
				stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
			}
			stepj = fd * stepmax;
			xj[j] += stepj;
			xij[j] += stepj;

			f[i*N+j] = ((FUNCPT_EVAL(funcpt,xij,N) - FUNCPT_EVAL(funcpt,xi,N)) - (FUNCPT_EVAL(funcpt,xj,N) - FUNCPT_EVAL(funcpt,x,N)))/(stepi * stepj);
			if (f[i*N+j] >= DBL_MAX || f[i*N+j] <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			if (f[i*N+j] != f[i*N+j]) {
				printf("Program Exiting as the function returns NaN");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			xj[j] -= stepj;
			xij[j] -= stepj;
		}

	}
	
	free(xi);
	free(xj);
	free(xij);
	return retval;
	
}